

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O2

void __thiscall SendReceiver::printRequestData(SendReceiver *this)

{
  ostream *poVar1;
  
  if ((this->super_JHandler).status == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Full url to file: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    (this->super_JHandler).url_ptr.
                                    super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
    poVar1 = std::operator<<(poVar1,"\nShort url to file: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    &((this->super_JHandler).url_ptr.
                                      super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->str_short);
    poVar1 = std::operator<<(poVar1,"\nFile id: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    (this->super_JHandler).MD_ptr.
                                    super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    poVar1 = std::operator<<(poVar1,"\nFilename: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    &((this->super_JHandler).MD_ptr.
                                      super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->name);
    poVar1 = std::operator<<(poVar1,"\nSize of file: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    &((this->super_JHandler).MD_ptr.
                                      super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->size);
    std::operator<<(poVar1,'\n');
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_JHandler).error_msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SendReceiver::printRequestData() {
  if (status) {
    std::cout << "Full url to file: " << url_ptr->str_full
              << "\nShort url to file: " << url_ptr->str_short
              << "\nFile id: " << MD_ptr->id
              << "\nFilename: " << MD_ptr->name
              << "\nSize of file: " << MD_ptr->size << '\n';
  } else
    std::cerr << "Error: " << error_msg << std::endl;
}